

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

void msocket_set_handler(msocket_t *self,msocket_handler_t *handlerTable,void *handlerArg)

{
  _func_void_void_ptr_msocket_server_tag_ptr_msocket_t_ptr *p_Var1;
  _func_void_void_ptr_char_ptr_uint16_t_uint8_t_ptr_uint32_t *p_Var2;
  _func_void_void_ptr_char_ptr_uint16_t *p_Var3;
  _func_void_void_ptr *p_Var4;
  _func_void_uint32_t *p_Var5;
  msocket_handler_t *pmVar6;
  
  if (self != (msocket_t *)0x0) {
    if (self->handlerTable != (msocket_handler_t *)0x0) {
      free(self->handlerTable);
    }
    pmVar6 = (msocket_handler_t *)malloc(0x30);
    self->handlerTable = pmVar6;
    if (pmVar6 != (msocket_handler_t *)0x0) {
      p_Var1 = handlerTable->tcp_accept;
      p_Var2 = handlerTable->udp_msg;
      p_Var3 = handlerTable->tcp_connected;
      p_Var4 = handlerTable->tcp_disconnected;
      p_Var5 = handlerTable->tcp_inactivity;
      pmVar6->tcp_data = handlerTable->tcp_data;
      pmVar6->tcp_inactivity = p_Var5;
      pmVar6->tcp_connected = p_Var3;
      pmVar6->tcp_disconnected = p_Var4;
      pmVar6->tcp_accept = p_Var1;
      pmVar6->udp_msg = p_Var2;
      self->handlerArg = handlerArg;
    }
  }
  return;
}

Assistant:

void msocket_set_handler(msocket_t *self, const msocket_handler_t *handlerTable, void *handlerArg){
   if(self != 0){
      if(self->handlerTable != 0){
         free(self->handlerTable);
      }
      self->handlerTable = (msocket_handler_t*) malloc(sizeof(msocket_handler_t));
      if(self->handlerTable != 0){
        memcpy(self->handlerTable,handlerTable,sizeof(msocket_handler_t));
        self->handlerArg = handlerArg;
      }
   }
}